

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O3

bool_t ReadHex(tchar_t **p,intptr_t *Out,bool_t RGB,bool_t Neg)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  bool_t bVar5;
  ulong uVar6;
  ulong uVar7;
  
  pcVar1 = *p;
  uVar3 = Hex((int)*pcVar1);
  if ((int)uVar3 < 0) {
    bVar5 = 0;
  }
  else {
    uVar7 = 0;
    uVar6 = 0;
    do {
      uVar7 = uVar7 * 0x10 + (ulong)uVar3;
      lVar2 = uVar6 + 1;
      uVar6 = uVar6 + 1;
      uVar3 = Hex((int)pcVar1[lVar2]);
    } while (-1 < (int)uVar3);
    uVar3 = (uint)uVar7 << 8;
    if (6 < uVar6) {
      uVar3 = (uint)uVar7;
    }
    uVar4 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)
    ;
    if (RGB == 0) {
      uVar4 = uVar7;
    }
    uVar7 = -uVar4;
    if (Neg == 0) {
      uVar7 = uVar4;
    }
    *Out = uVar7;
    *p = pcVar1 + uVar6;
    bVar5 = 1;
  }
  return bVar5;
}

Assistant:

static NOINLINE bool_t ReadHex(const tchar_t** p,intptr_t* Out,bool_t RGB, bool_t Neg)
{
    const tchar_t* s = *p;
    intptr_t v = 0;
    intptr_t w;
    size_t n = 0;

    if ((w = Hex(*s))<0)
        return 0;

    do
    {
        ++n;
        v = v*16+w;
    } while ((w = Hex(*(++s)))>=0);

    if (RGB)
    {
        if (n<=6)
            v <<= 8;
        v = INT32BE(v);
    }

    if (Neg)
        v = -v;

    *Out = v;
    *p = s;
    return 1;
}